

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

StringRef __thiscall llvm::sys::path::remove_leading_dotslash(path *this,StringRef Path,Style style)

{
  char cVar1;
  size_t sVar2;
  StringRef SVar3;
  bool local_52;
  bool local_51;
  path *local_50;
  char *local_48;
  path *local_40;
  char *local_38;
  undefined1 auStack_28 [4];
  Style style_local;
  StringRef Path_local;
  
  Path_local.Data = Path.Data;
  _auStack_28 = this;
  while( true ) {
    sVar2 = StringRef::size((StringRef *)auStack_28);
    local_51 = false;
    if (2 < sVar2) {
      cVar1 = StringRef::operator[]((StringRef *)auStack_28,0);
      local_51 = false;
      if (cVar1 == '.') {
        cVar1 = StringRef::operator[]((StringRef *)auStack_28,1);
        local_51 = is_separator(cVar1,(Style)Path.Length);
      }
    }
    if (local_51 == false) break;
    SVar3 = StringRef::substr((StringRef *)auStack_28,2,0xffffffffffffffff);
    local_40 = (path *)SVar3.Data;
    _auStack_28 = local_40;
    local_38 = (char *)SVar3.Length;
    Path_local.Data = local_38;
    while( true ) {
      sVar2 = StringRef::size((StringRef *)auStack_28);
      local_52 = false;
      if (sVar2 != 0) {
        cVar1 = StringRef::operator[]((StringRef *)auStack_28,0);
        local_52 = is_separator(cVar1,(Style)Path.Length);
      }
      if (local_52 == false) break;
      SVar3 = StringRef::substr((StringRef *)auStack_28,1,0xffffffffffffffff);
      local_50 = (path *)SVar3.Data;
      _auStack_28 = local_50;
      local_48 = (char *)SVar3.Length;
      Path_local.Data = local_48;
    }
  }
  SVar3.Length = (size_t)Path_local.Data;
  SVar3.Data = (char *)_auStack_28;
  return SVar3;
}

Assistant:

StringRef remove_leading_dotslash(StringRef Path, Style style) {
  // Remove leading "./" (or ".//" or "././" etc.)
  while (Path.size() > 2 && Path[0] == '.' && is_separator(Path[1], style)) {
    Path = Path.substr(2);
    while (Path.size() > 0 && is_separator(Path[0], style))
      Path = Path.substr(1);
  }
  return Path;
}